

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_IteratorNext2(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                        int *pdone)

{
  JSValueUnion JVar1;
  ulong uVar2;
  JSValue JVar3;
  JSValueUnion local_28;
  undefined8 local_20;
  
  JVar1 = method.u;
  if ((((int)method.tag == -1) && (*(short *)((long)JVar1.ptr + 6) == 0xc)) &&
     (*(char *)((long)JVar1.ptr + 0x41) == '\f')) {
    if (argc == 0) {
      argv = (JSValue *)&local_28;
      local_28.int32 = 0;
      local_20 = 3;
    }
    JVar3 = (JSValue)(**(code **)((long)JVar1.ptr + 0x38))
                               (ctx,enum_obj.u.float64,enum_obj.tag,argc,argv,pdone,
                                (int)*(short *)((long)JVar1.ptr + 0x42));
    uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
  }
  else {
    JVar3 = JS_Call(ctx,method,enum_obj,argc,argv);
    if ((int)JVar3.tag == -1) {
      *pdone = 2;
      uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
    }
    else {
      if ((int)JVar3.tag != 6) {
        JS_FreeValue(ctx,JVar3);
        JS_ThrowTypeError(ctx,"iterator must return an object");
      }
      *pdone = 0;
      JVar3 = (JSValue)(ZEXT816(6) << 0x40);
      uVar2 = 0;
    }
  }
  JVar3.u.ptr = (void *)(JVar3.u._0_4_ | uVar2);
  return JVar3;
}

Assistant:

static JSValue JS_IteratorNext2(JSContext *ctx, JSValueConst enum_obj,
                                JSValueConst method,
                                int argc, JSValueConst *argv, int *pdone)
{
    JSValue obj;

    /* fast path for the built-in iterators (avoid creating the
       intermediate result object) */
    if (JS_IsObject(method)) {
        JSObject *p = JS_VALUE_GET_OBJ(method);
        if (p->class_id == JS_CLASS_C_FUNCTION &&
            p->u.cfunc.cproto == JS_CFUNC_iterator_next) {
            JSCFunctionType func;
            JSValueConst args[1];

            /* in case the function expects one argument */
            if (argc == 0) {
                args[0] = JS_UNDEFINED;
                argv = args;
            }
            func = p->u.cfunc.c_function;
            return func.iterator_next(ctx, enum_obj, argc, argv,
                                      pdone, p->u.cfunc.magic);
        }
    }
    obj = JS_Call(ctx, method, enum_obj, argc, argv);
    if (JS_IsException(obj))
        goto fail;
    if (!JS_IsObject(obj)) {
        JS_FreeValue(ctx, obj);
        JS_ThrowTypeError(ctx, "iterator must return an object");
        goto fail;
    }
    *pdone = 2;
    return obj;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}